

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFilePathChecksum.cxx
# Opt level: O2

void __thiscall
cmFilePathChecksum::setupParentDirs
          (cmFilePathChecksum *this,string *currentSrcDir,string *currentBinDir,
          string *projectSrcDir,string *projectBinDir)

{
  string sStack_48;
  
  cmsys::SystemTools::GetRealPath(&sStack_48,currentSrcDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)this,(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  cmsys::SystemTools::GetRealPath(&sStack_48,currentBinDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)((this->parentDirs)._M_elems + 1),(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  cmsys::SystemTools::GetRealPath(&sStack_48,projectSrcDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)((this->parentDirs)._M_elems + 2),(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  cmsys::SystemTools::GetRealPath(&sStack_48,projectBinDir,(string *)0x0);
  std::__cxx11::string::operator=((string *)((this->parentDirs)._M_elems + 3),(string *)&sStack_48);
  std::__cxx11::string::~string((string *)&sStack_48);
  std::__cxx11::string::assign((char *)&(this->parentDirs)._M_elems[0].second);
  std::__cxx11::string::assign((char *)&(this->parentDirs)._M_elems[1].second);
  std::__cxx11::string::assign((char *)&(this->parentDirs)._M_elems[2].second);
  std::__cxx11::string::assign((char *)&(this->parentDirs)._M_elems[3].second);
  return;
}

Assistant:

void cmFilePathChecksum::setupParentDirs(std::string const& currentSrcDir,
                                         std::string const& currentBinDir,
                                         std::string const& projectSrcDir,
                                         std::string const& projectBinDir)
{
  this->parentDirs[0].first = cmSystemTools::GetRealPath(currentSrcDir);
  this->parentDirs[1].first = cmSystemTools::GetRealPath(currentBinDir);
  this->parentDirs[2].first = cmSystemTools::GetRealPath(projectSrcDir);
  this->parentDirs[3].first = cmSystemTools::GetRealPath(projectBinDir);

  this->parentDirs[0].second = "CurrentSource";
  this->parentDirs[1].second = "CurrentBinary";
  this->parentDirs[2].second = "ProjectSource";
  this->parentDirs[3].second = "ProjectBinary";
}